

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgecko.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  double dVar2;
  float fVar3;
  string test;
  string test_00;
  string test_01;
  string test_02;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  uint nodes;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  string error_2;
  size_type __dnew_2;
  uint maxsize;
  uint maxdims;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  string error;
  Graph graph;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  _Alloc_hider in_stack_fffffffffffffcb0;
  _Alloc_hider _Var24;
  Functional *local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  float local_310;
  float local_30c;
  uint local_308;
  uint local_304;
  undefined1 local_300 [32];
  ulong local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ulong local_258;
  ulong local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [40];
  pointer local_1e0;
  pointer local_1d8;
  pointer local_1c8;
  pointer local_1c0;
  pointer local_1b0;
  pointer local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  string local_150;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 local_110 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [16];
  string *local_90;
  int local_88;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  local_304 = 5;
  local_308 = 6;
  if ((argc != 1) &&
     (((argc != 2 && ((argc != 3 || (iVar4 = sscanf(argv[2],"%u",&local_308), iVar4 != 1)))) ||
      (iVar4 = sscanf(argv[1],"%u",&local_304), iVar4 != 1)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage: testgecko [maxdims [maxsize]]",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    return 1;
  }
  local_70._M_allocated_capacity = (size_type)(string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"library version test","");
  pcVar12 = Gecko::version_string;
  if (Gecko::version_string == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108158);
  }
  else {
    sVar7 = strlen(Gecko::version_string);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"library version ",0x10);
  lVar13 = std::cerr;
  *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
       *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) | 0x200;
  *(uint *)(__cxa_finalize + *(long *)(lVar13 + -0x18)) =
       *(uint *)(__cxa_finalize + *(long *)(lVar13 + -0x18)) & 0xffffffb5 | 8;
  iVar4 = (int)Gecko::version;
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  lVar13 = *(long *)poVar8;
  lVar1 = *(long *)(lVar13 + -0x18);
  *(uint *)(poVar8 + lVar1 + 0x18) = *(uint *)(poVar8 + lVar1 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar13 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_b0._M_allocated_capacity = (size_type)local_a0;
  if (iVar4 == 0x100) {
    local_b0._8_8_ = 0;
    local_a0[0] = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"header and binary version mismatch","");
  }
  test._M_string_length = in_stack_fffffffffffffca0;
  test._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc98;
  test.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffca8;
  test.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcac;
  test.field_2._8_8_ = in_stack_fffffffffffffcb0._M_p;
  iVar4 = report(test,(string *)local_70._M_allocated_capacity,local_70._8_4_);
  if ((undefined1 *)local_b0._M_allocated_capacity != local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity);
  }
  if ((string *)local_70._M_allocated_capacity != (string *)local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  Gecko::Graph::Graph((Graph *)local_208,0x10000);
  uVar14 = 0;
  do {
    uVar11 = uVar14 + 1;
    uVar16 = (uint)(Graph *)local_208;
    if ((1 < uVar11) && (Gecko::Graph::insert_arc(uVar16,uVar11,1.0,1.0), uVar14 == 0xffff)) break;
    Gecko::Graph::insert_arc(uVar16,uVar11,1.0,1.0);
    uVar14 = uVar11;
  } while (uVar11 != 0x10000);
  if (((long)local_1d8 - (long)local_1e0 & 0xffffffff0U) == 0x100010) {
    if ((((ulong)((long)local_1c0 - (long)local_1c8) >> 2) + 0x1ffffffff & 0x1fffffffe) == 0x1fffe)
    {
      plVar9 = (long *)operator_new(8);
      *plVar9 = (long)&PTR__Functional_00106cf0;
      in_stack_fffffffffffffc98 = 0;
      Gecko::Graph::order((Functional *)local_208,(uint)plVar9,1,4,0,(Progress *)0x1);
      (**(code **)(*plVar9 + 8))(plVar9);
      lVar13 = 1;
      do {
        if (lVar13 == 0x10000) {
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          local_298._M_string_length = 0;
          local_298.field_2._M_allocated_capacity =
               local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
          goto LAB_00102a37;
        }
        uVar14 = ((pointer)(local_208._16_8_ - 4))[lVar13];
        uVar11 = *(uint *)(local_208._16_8_ + lVar13 * 4);
        iVar5 = Gecko::Graph::arc_index((uint)local_208,uVar14);
        lVar13 = lVar13 + 1;
      } while (iVar5 != 0);
      local_278.field_2._M_allocated_capacity._0_2_ = 0x7b;
      local_278._M_string_length = 1;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      stringize<unsigned_int>((string *)&stack0xfffffffffffffcb0,uVar14);
      std::operator+(&local_228,&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffcb0);
      local_178.field_2._M_allocated_capacity._0_2_ = 0x202c;
      local_178._M_string_length = 2;
      local_178.field_2._M_local_buf[2] = '\0';
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                     &local_228,&local_178);
      stringize<unsigned_int>(&local_150,uVar11);
      std::operator+(&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                     &local_150);
      local_330._M_dataplus._M_p = (pointer)0x10;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)&local_330);
      local_248.field_2._M_allocated_capacity = (size_type)local_330._M_dataplus._M_p;
      builtin_strncpy(local_248._M_dataplus._M_p,"} is not an edge",0x10);
      local_248._M_string_length = (size_type)local_330._M_dataplus._M_p;
      local_248._M_dataplus._M_p[(long)local_330._M_dataplus._M_p] = '\0';
      std::operator+(&local_298,&local_2d8,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((Functional *)local_300._0_8_ != (Functional *)(local_300 + 0x10)) {
        operator_delete((void *)local_300._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffcb0._M_p != &local_340) {
        operator_delete(in_stack_fffffffffffffcb0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      goto LAB_00102a37;
    }
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_2d8._M_dataplus._M_p = (pointer)0x14;
    local_298._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)&local_2d8);
    uVar18._0_1_ = 't';
    uVar18._1_1_ = ' ';
    uVar18._2_1_ = 'e';
    uVar18._3_1_ = 'd';
    uVar21._0_1_ = 'g';
    uVar21._1_1_ = 'e';
    uVar21._2_1_ = ' ';
    uVar21._3_1_ = 'c';
  }
  else {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_2d8._M_dataplus._M_p = (pointer)0x14;
    local_298._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)&local_2d8);
    uVar18._0_1_ = 't';
    uVar18._1_1_ = ' ';
    uVar18._2_1_ = 'n';
    uVar18._3_1_ = 'o';
    uVar21._0_1_ = 'd';
    uVar21._1_1_ = 'e';
    uVar21._2_1_ = ' ';
    uVar21._3_1_ = 'c';
  }
  *(undefined4 *)local_298._M_dataplus._M_p = 0x6f636e69;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 4) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 5) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 6) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 7) = 'c';
  *(undefined4 *)(local_298._M_dataplus._M_p + 8) = uVar18;
  *(undefined4 *)(local_298._M_dataplus._M_p + 0xc) = uVar21;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x10) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x11) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x12) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x13) = 't';
  local_298._M_string_length = (size_type)local_2d8._M_dataplus._M_p;
  local_298._M_dataplus._M_p[(long)local_2d8._M_dataplus._M_p] = '\0';
  local_298.field_2._M_allocated_capacity = (size_type)local_2d8._M_dataplus._M_p;
LAB_00102a37:
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if (local_1c8 != (pointer)0x0) {
    operator_delete(local_1c8);
  }
  if (local_1e0 != (pointer)0x0) {
    operator_delete(local_1e0);
  }
  if ((pointer)local_208._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._16_8_);
  }
  local_90 = (string *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"path graph test","");
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_60 + 0x10),local_298._M_dataplus._M_p,
             local_298._M_string_length + local_298._M_dataplus._M_p);
  test_00._M_string_length = in_stack_fffffffffffffca0;
  test_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc98;
  test_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffca8;
  test_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcac;
  test_00.field_2._8_8_ = in_stack_fffffffffffffcb0._M_p;
  iVar5 = report(test_00,local_90,local_88);
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  if (local_90 != (string *)local_80) {
    operator_delete(local_90);
  }
  iVar5 = iVar5 + iVar4;
  if (local_304 == 0) {
    iVar4 = 2;
  }
  else {
    iVar4 = 2;
    uVar14 = 1;
    do {
      nodes = 1 << ((byte)uVar14 & 0x1f);
      Gecko::Graph::Graph((Graph *)local_208,nodes);
      uVar11 = 1;
      do {
        if (uVar14 != 0) {
          uVar16 = 0;
          do {
            iVar6 = Gecko::Graph::insert_arc((uint)local_208,uVar11,1.0,1.0);
            if (iVar6 == 0) {
              local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              local_2d8._M_dataplus._M_p = (pointer)0x14;
              local_330._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_2d8);
              *(undefined8 *)local_330._M_dataplus._M_p = 0x65736e6920637261;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 8) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 9) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 10) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0xb) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0xc) = 'n';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0xd) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0xe) = 'f';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0xf) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0x10) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0x11) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0x12) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p + 0x13) = 'd';
              goto LAB_00102eff;
            }
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 <= nodes);
      if ((int)((ulong)((long)local_1d8 - (long)local_1e0) >> 4) - 1U == nodes) {
        if ((uVar14 << ((byte)uVar14 & 0x1f)) >> 1 !=
            (uint)(((ulong)((long)local_1c0 - (long)local_1c8) >> 2) + 0x1ffffffff >> 1)) {
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          local_2d8._M_dataplus._M_p = (pointer)0x14;
          local_330._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_2d8);
          uVar19._0_1_ = 't';
          uVar19._1_1_ = ' ';
          uVar19._2_1_ = 'e';
          uVar19._3_1_ = 'd';
          uVar22._0_1_ = 'g';
          uVar22._1_1_ = 'e';
          uVar22._2_1_ = ' ';
          uVar22._3_1_ = 'c';
          goto LAB_00103116;
        }
        plVar9 = (long *)operator_new(8);
        *plVar9 = (long)&PTR__Functional_00106cf0;
        in_stack_fffffffffffffc98 = 0;
        Gecko::Graph::order((Functional *)local_208,(uint)plVar9,4,6,1,(Progress *)0x1);
        (**(code **)(*plVar9 + 8))(plVar9);
        uVar17 = 0;
        do {
          if (nodes - 1 == uVar17) {
            local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
            local_330._M_string_length = 0;
            local_330.field_2._M_allocated_capacity =
                 local_330.field_2._M_allocated_capacity & 0xffffffffffffff00;
            in_stack_fffffffffffffca8 = iVar5;
            in_stack_fffffffffffffcac = iVar4;
            goto LAB_00102f1e;
          }
          uVar11 = *(uint *)(local_208._16_8_ + uVar17 * 4);
          uVar16 = ((pointer)(local_208._16_8_ + 4))[uVar17];
          iVar6 = Gecko::Graph::arc_index((uint)local_208,uVar11);
          uVar17 = uVar17 + 1;
        } while (iVar6 != 0);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        local_278.field_2._M_allocated_capacity._0_2_ = 0x7b;
        local_278._M_string_length = 1;
        stringize<unsigned_int>((string *)&stack0xfffffffffffffcb0,uVar11);
        std::operator+(&local_228,&local_278,(string *)&stack0xfffffffffffffcb0);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        local_178.field_2._M_allocated_capacity._0_2_ = 0x202c;
        local_178._M_string_length = 2;
        local_178.field_2._M_local_buf[2] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,&local_228,&local_178);
        in_stack_fffffffffffffca8 = iVar5;
        in_stack_fffffffffffffcac = iVar4;
        stringize<unsigned_int>(&local_150,uVar16);
        std::operator+(&local_2d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,&local_150);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x10;
        local_248._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)&local_158);
        local_248.field_2._M_allocated_capacity = (size_type)local_158;
        builtin_strncpy(local_248._M_dataplus._M_p,"} is not an edge",0x10);
        local_248._M_string_length = (size_type)local_158;
        local_248._M_dataplus._M_p[(long)local_158] = '\0';
        std::operator+(&local_330,&local_2d8,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((Functional *)local_300._0_8_ != (Functional *)(local_300 + 0x10)) {
          operator_delete((void *)local_300._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffcb0._M_p != &local_340) {
          operator_delete(in_stack_fffffffffffffcb0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
      }
      else {
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        local_2d8._M_dataplus._M_p = (pointer)0x14;
        local_330._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_2d8);
        uVar19._0_1_ = 't';
        uVar19._1_1_ = ' ';
        uVar19._2_1_ = 'n';
        uVar19._3_1_ = 'o';
        uVar22._0_1_ = 'd';
        uVar22._1_1_ = 'e';
        uVar22._2_1_ = ' ';
        uVar22._3_1_ = 'c';
LAB_00103116:
        *(undefined4 *)local_330._M_dataplus._M_p = 0x6f636e69;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 4) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 5) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 6) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 7) = 'c';
        *(undefined4 *)(local_330._M_dataplus._M_p + 8) = uVar19;
        *(undefined4 *)(local_330._M_dataplus._M_p + 0xc) = uVar22;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 0x10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 0x11) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 0x12) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p + 0x13) = 't';
LAB_00102eff:
        local_330._M_dataplus._M_p[(long)local_2d8._M_dataplus._M_p] = '\0';
        in_stack_fffffffffffffca8 = iVar5;
        in_stack_fffffffffffffcac = iVar4;
        local_330._M_string_length = (size_type)local_2d8._M_dataplus._M_p;
        local_330.field_2._M_allocated_capacity = (size_type)local_2d8._M_dataplus._M_p;
      }
LAB_00102f1e:
      if (local_198 != (pointer)0x0) {
        operator_delete(local_198);
      }
      if (local_1b0 != (pointer)0x0) {
        operator_delete(local_1b0);
      }
      if (local_1c8 != (pointer)0x0) {
        operator_delete(local_1c8);
      }
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if ((pointer)local_208._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_208._16_8_);
      }
      local_208._0_8_ = (Functional *)(local_208 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"hypercube test #","");
      stringize<unsigned_int>(&local_2d8,uVar14);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_2d8);
      local_f0._M_allocated_capacity = (size_type)local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_330._M_dataplus._M_p,
                 local_330._M_string_length + local_330._M_dataplus._M_p);
      test_01._M_string_length = in_stack_fffffffffffffca0;
      test_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc98;
      test_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffca8;
      test_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcac;
      test_01.field_2._8_8_ = in_stack_fffffffffffffcb0._M_p;
      iVar6 = report(test_01,(string *)local_d0._0_8_,(int)local_d0._8_8_);
      if ((undefined1 *)local_f0._M_allocated_capacity != local_e0) {
        operator_delete((void *)local_f0._M_allocated_capacity);
      }
      if ((string *)local_d0._0_8_ != (string *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((Functional *)local_208._0_8_ != (Functional *)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      iVar5 = iVar5 + iVar6;
      iVar4 = iVar4 + 1;
      uVar14 = uVar14 + 1;
    } while (uVar14 <= local_304);
  }
  if (local_308 != 0) {
    uVar14 = 1;
    local_258 = 2;
    local_250 = 0;
    do {
      local_2d8._M_dataplus._M_p = (pointer)0x0;
      local_2d8._M_string_length = 0x3ff0000000000000;
      local_2d8.field_2._M_allocated_capacity = 0x4008000000000000;
      local_2d8.field_2._8_8_ = 0x406c200000000000;
      uStack_2b8 = 0x4125061200000000;
      local_2b0 = 0x4240fc49c2668000;
      uStack_2a8 = 0x43ab53e135c9de4c;
      local_2e0 = (ulong)uVar14;
      if (uVar14 < 8) {
        uVar11 = uVar14 - 1;
        fVar3 = (float)(uVar14 * uVar11 * 2);
        if (fVar3 == 0.0) {
          local_310 = 0.0;
          _Var24._M_p = in_stack_fffffffffffffcb0._M_p;
        }
        else {
          dVar2 = log((double)(&local_2d8._M_dataplus)[local_2e0]._M_p);
          dVar2 = exp(dVar2 / (double)(uint)fVar3);
          local_310 = (float)dVar2;
          _Var24._M_p = in_stack_fffffffffffffcb0._M_p;
        }
        local_30c = fVar3;
        Gecko::Graph::Graph((Graph *)local_208,0);
        uVar14 = (int)local_2e0 * (int)local_2e0;
        if (local_2e0 != 0) {
          uVar16 = 0;
          do {
            uVar17 = local_2e0;
            Gecko::Graph::insert_node(1.0);
            uVar10 = uVar16 + 1;
            uVar15 = (uint)((ulong)uVar16 % (uVar17 & 0xffffffff));
            if (uVar15 != 0) {
              Gecko::Graph::insert_arc((uint)local_208,uVar10,1.0,1.0);
            }
            if (uVar15 < uVar11) {
              Gecko::Graph::insert_arc((uint)local_208,uVar10,1.0,1.0);
            }
            if ((uint)local_2e0 <= uVar16) {
              Gecko::Graph::insert_arc((uint)local_208,uVar10,1.0,1.0);
            }
            if ((uint)((ulong)uVar16 / (uVar17 & 0xffffffff)) < uVar11) {
              Gecko::Graph::insert_arc((uint)local_208,uVar10,1.0,1.0);
            }
            uVar15 = uVar16 + 2;
            uVar16 = uVar10;
          } while (uVar15 <= uVar14);
        }
        if ((int)((ulong)((long)local_1d8 - (long)local_1e0) >> 4) - 1U == uVar14) {
          in_stack_fffffffffffffcb0._M_p = (pointer)&local_340;
          in_stack_fffffffffffffca8 = iVar5;
          in_stack_fffffffffffffcac = iVar4;
          if (local_30c !=
              (float)(((ulong)((long)local_1c0 - (long)local_1c8) >> 2) + 0x1ffffffff >> 1)) {
            local_300._0_8_ = (Functional *)0x14;
            in_stack_fffffffffffffcb0._M_p =
                 (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&stack0xfffffffffffffcb0,(ulong)local_300);
            uVar20._0_1_ = 't';
            uVar20._1_1_ = ' ';
            uVar20._2_1_ = 'e';
            uVar20._3_1_ = 'd';
            uVar23._0_1_ = 'g';
            uVar23._1_1_ = 'e';
            uVar23._2_1_ = ' ';
            uVar23._3_1_ = 'c';
            goto LAB_0010359c;
          }
          plVar9 = (long *)operator_new(8);
          *plVar9 = (long)&PTR__Functional_00106cf0;
          in_stack_fffffffffffffc98 = 0;
          Gecko::Graph::order((Functional *)local_208,(uint)plVar9,9,5,2,(Progress *)0x1);
          local_30c = (float)Gecko::Graph::cost();
          (**(code **)(*plVar9 + 8))(plVar9);
          if (local_30c <= local_310 * 1.01) {
            local_348 = (Functional *)0x0;
            local_340._M_allocated_capacity = local_340._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            stringize<float>(&local_228,local_30c);
            local_300._0_8_ = local_300 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_300,local_228._M_dataplus._M_p,
                       local_228._M_dataplus._M_p + local_228._M_string_length);
            std::__cxx11::string::append((char *)local_300);
            stringize<float>(&local_278,local_310);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffcb0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_300,&local_278);
            in_stack_fffffffffffffcb0._M_p = _Var24._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p);
              in_stack_fffffffffffffcb0._M_p = _Var24._M_p;
            }
            if ((Functional *)local_300._0_8_ != (Functional *)(local_300 + 0x10)) {
              operator_delete((void *)local_300._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
          }
        }
        else {
          local_300._0_8_ = (Functional *)0x14;
          in_stack_fffffffffffffcb0._M_p =
               (pointer)std::__cxx11::string::_M_create
                                  ((ulong *)&stack0xfffffffffffffcb0,(ulong)local_300);
          uVar20._0_1_ = 't';
          uVar20._1_1_ = ' ';
          uVar20._2_1_ = 'n';
          uVar20._3_1_ = 'o';
          uVar23._0_1_ = 'd';
          uVar23._1_1_ = 'e';
          uVar23._2_1_ = ' ';
          uVar23._3_1_ = 'c';
          in_stack_fffffffffffffca8 = iVar5;
          in_stack_fffffffffffffcac = iVar4;
LAB_0010359c:
          *(undefined4 *)in_stack_fffffffffffffcb0._M_p = 0x6f636e69;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 4) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 5) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 6) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 7) = 'c';
          *(undefined4 *)(in_stack_fffffffffffffcb0._M_p + 8) = uVar20;
          *(undefined4 *)(in_stack_fffffffffffffcb0._M_p + 0xc) = uVar23;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 0x10) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 0x11) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 0x12) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffcb0._M_p + 0x13) = 't';
          local_348 = (Functional *)local_300._0_8_;
          in_stack_fffffffffffffcb0._M_p[local_300._0_8_] = '\0';
          local_340._M_allocated_capacity = local_300._0_8_;
        }
        if (local_198 != (pointer)0x0) {
          operator_delete(local_198);
        }
        if (local_1b0 != (pointer)0x0) {
          operator_delete(local_1b0);
        }
        if (local_1c8 != (pointer)0x0) {
          operator_delete(local_1c8);
        }
        if (local_1e0 != (pointer)0x0) {
          operator_delete(local_1e0);
        }
        if ((pointer)local_208._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_208._16_8_);
        }
      }
      else {
        local_208._0_8_ = (Functional *)0x1e;
        in_stack_fffffffffffffcb0._M_p =
             (pointer)std::__cxx11::string::_M_create
                                ((ulong *)&stack0xfffffffffffffcb0,(ulong)local_208);
        local_340._M_allocated_capacity = local_208._0_8_;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0xf) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x10) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x11) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x12) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x13) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x14) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x15) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x16) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x17) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x18) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x19) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x1a) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x1b) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x1c) = 'z';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0x1d) = 'e';
        *(undefined8 *)in_stack_fffffffffffffcb0._M_p = 0x7a69732064697267;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0xb) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0xc) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffcb0._M_p + 0xf) = 'd';
        local_348 = (Functional *)local_208._0_8_;
        in_stack_fffffffffffffcb0._M_p[local_208._0_8_] = '\0';
      }
      local_208._0_8_ = (Functional *)(local_208 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"grid test #","");
      stringize<unsigned_int>(&local_2d8,(uint)local_2e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_2d8);
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_130,in_stack_fffffffffffffcb0._M_p,
                 in_stack_fffffffffffffcb0._M_p + (long)&local_348->_vptr_Functional);
      test_02._M_string_length = in_stack_fffffffffffffca0;
      test_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc98;
      test_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffca8;
      test_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcac;
      test_02.field_2._8_8_ = in_stack_fffffffffffffcb0._M_p;
      iVar6 = report(test_02,(string *)local_110._0_8_,(int)local_110._8_8_);
      if (local_130[0] != local_120) {
        operator_delete(local_130[0]);
      }
      if ((string *)local_110._0_8_ != (string *)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((Functional *)local_208._0_8_ != (Functional *)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffcb0._M_p != &local_340) {
        operator_delete(in_stack_fffffffffffffcb0._M_p);
      }
      iVar5 = iVar5 + iVar6;
      iVar4 = iVar4 + 1;
      uVar14 = (int)local_2e0 + 1;
      local_258 = (ulong)((int)local_258 + 1);
      local_250 = (ulong)((int)local_250 - 1);
    } while (uVar14 <= local_308);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  poVar8 = (ostream *)&std::cerr;
  std::ostream::put('X');
  std::ostream::flush();
  if (iVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"all tests passed",0x10);
  }
  else {
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test",5);
    pcVar12 = "";
    if (iVar5 != 1) {
      pcVar12 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,(ulong)(iVar5 != 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," of ",4);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," failed",7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return (uint)(iVar5 != 0);
}

Assistant:

int main(int argc, char* argv[])
{
  uint tests = 0;    // number of tests performed
  uint failures = 0; // number of failed tests
  uint maxdims = 5;  // number of hypercube dimensions
  uint maxsize = 6;  // max grid dimensions

  switch (argc) {
    case 3:
      if (sscanf(argv[2], "%u", &maxsize) != 1)
        goto usage;
      // FALLTHROUGH
    case 2:
      if (sscanf(argv[1], "%u", &maxdims) != 1)
        goto usage;
      // FALLTHROUGH
    case 1:
      break;
    default:
    usage:
      std::cerr << "Usage: testgecko [maxdims [maxsize]]" << std::endl;
      return EXIT_FAILURE;
  }

  // print version info and ensure header matches binary
  failures += report("library version test", init() ? std::string() : std::string("header and binary version mismatch"));
  tests++;

  // order path
  std::string error = path_test();
  failures += report("path graph test", error);
  tests++;

  // order hypercubes
  for (uint dims = 1; dims <= maxdims; dims++) {
    std::string error = hypercube_test(dims);
    failures += report(std::string("hypercube test #") + stringize(dims), error);
    tests++;
  }

  // order grids
  for (uint size = 1; size <= maxsize; size++) {
    std::string error = grid_test(size);
    failures += report(std::string("grid test #") + stringize(size), error);
    tests++;
  }

  // summarize tests
  return finish(failures, tests);
}